

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O3

void anon_unknown.dwarf_2fd93e::fillPixelsColor(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  unsigned_short uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float i;
  ulong local_68;
  long local_60;
  
  if (0 < h) {
    local_60 = 0;
    local_68 = 0;
    do {
      if (0 < w) {
        dVar2 = (double)(int)local_68;
        uVar6 = 0;
        do {
          lVar7 = pixels->_sizeY;
          pRVar1 = pixels->_data;
          dVar3 = (double)(int)uVar6;
          dVar4 = sin(dVar3 * 0.05);
          fVar8 = (float)(dVar4 * 0.5 + 0.8);
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          lVar7 = lVar7 * local_60;
          *(unsigned_short *)((long)&pRVar1[uVar6].r._h + lVar7) = uVar5;
          dVar4 = sin(dVar3 * 0.02 + dVar2 * 0.02);
          fVar8 = (float)(dVar4 * 0.5 + 0.8);
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].g._h + lVar7) = uVar5;
          dVar4 = sin(dVar2 * 0.03);
          fVar8 = (float)(dVar4 * 0.5 + 0.8);
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].b._h + lVar7) = uVar5;
          dVar3 = sin(dVar3 * 0.05 + dVar2 * -0.05);
          i = (float)(dVar3 * 0.5 + 0.8);
          fVar8 = half::_toFloat[*(unsigned_short *)((long)&pRVar1[uVar6].r._h + lVar7)].f * i;
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].r._h + lVar7) = uVar5;
          fVar8 = half::_toFloat[*(unsigned_short *)((long)&pRVar1[uVar6].g._h + lVar7)].f * i;
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].g._h + lVar7) = uVar5;
          fVar8 = half::_toFloat[*(unsigned_short *)((long)&pRVar1[uVar6].b._h + lVar7)].f * i;
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
              uVar5 = half::convert((int)fVar8);
            }
            else {
              uVar5 = half::_eLut[(uint)fVar8 >> 0x17] +
                      (short)(((uint)fVar8 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)fVar8 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].b._h + lVar7) = uVar5;
          if ((i != 0.0) || (NAN(i))) {
            if (half::_eLut[(uint)i >> 0x17] == 0) {
              uVar5 = half::convert((int)i);
            }
            else {
              uVar5 = half::_eLut[(uint)i >> 0x17] +
                      (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >>
                             0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)i >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar6].a._h + lVar7) = uVar5;
          uVar6 = uVar6 + 1;
        } while ((uint)w != uVar6);
      }
      local_68 = local_68 + 1;
      local_60 = local_60 + 8;
    } while (local_68 != (uint)h);
  }
  return;
}

Assistant:

void
fillPixelsColor (Array2D <Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = 0.8 + 0.5 * sin (x * 0.05);
	    p.g = 0.8 + 0.5 * sin (x * 0.02 + y * 0.02);
	    p.b = 0.8 + 0.5 * sin (y * 0.03);

	    float t = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);

	    p.r *= t;
	    p.g *= t;
	    p.b *= t;
	    p.a  = t;
	}
    }
}